

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

void __thiscall
musicBlock::OPLchangeControl(musicBlock *this,uint channel,uchar controller,int value)

{
  byte bVar1;
  OPLio *pOVar2;
  undefined1 auVar3 [16];
  ushort uVar4;
  ushort uVar5;
  uint volume;
  long lVar6;
  byte bVar7;
  undefined7 in_register_00000011;
  uchar *puVar8;
  ulong *puVar9;
  channelEntry *pcVar10;
  uchar uVar11;
  ulong uVar12;
  ulong uVar13;
  
  if (0x11 < (uint)CONCAT71(in_register_00000011,controller)) {
    return;
  }
  uVar13 = (ulong)channel;
  uVar11 = (uchar)value;
  uVar4 = (ushort)value;
  switch(CONCAT71(in_register_00000011,controller) & 0xffffffff) {
  case 0:
    (this->driverdata).channelInstr[uVar13] = value;
    break;
  case 2:
    (this->driverdata).channelModulation[uVar13] = uVar11;
    pcVar10 = this->channels;
    for (uVar13 = 0; uVar13 < this->io->OPLchannels; uVar13 = uVar13 + 1) {
      if (pcVar10->channel == channel) {
        bVar1 = pcVar10->flags;
        pcVar10->time = this->MLtime;
        if (value < 0x28) {
          bVar7 = bVar1 & 0xfb;
          pcVar10->flags = bVar7;
        }
        else {
          bVar7 = bVar1 | 4;
          pcVar10->flags = bVar7;
        }
        if (bVar7 != bVar1) {
          writeModulation(this,(uint)uVar13,pcVar10->instr,(uint)(value >= 0x28));
        }
      }
      pcVar10 = pcVar10 + 1;
    }
    break;
  case 3:
    lVar6 = 0x54;
    goto LAB_0033d32e;
  case 4:
    (this->driverdata).channelPan[uVar13] = (schar)(value + -0x40);
    puVar9 = &this->channels[0].time;
    for (uVar13 = 0; pOVar2 = this->io, uVar13 < pOVar2->OPLchannels; uVar13 = uVar13 + 1) {
      if (((channelEntry *)(puVar9 + -4))->channel == channel) {
        *puVar9 = this->MLtime;
        OPLio::OPLwritePan(pOVar2,(uint)uVar13,(OPL2instrument *)puVar9[-1],value + -0x40);
      }
      puVar9 = puVar9 + 5;
    }
    break;
  case 5:
    lVar6 = 0xf4;
LAB_0033d32e:
    *(uchar *)((long)(this->driverdata).channelInstr + uVar13 + lVar6 + -0x14) = uVar11;
    puVar9 = &this->channels[0].time;
    for (uVar12 = 0; pOVar2 = this->io, uVar12 < pOVar2->OPLchannels; uVar12 = uVar12 + 1) {
      if (((channelEntry *)(puVar9 + -4))->channel == channel) {
        *puVar9 = this->MLtime;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (ulong)*(uint *)((long)puVar9 + -0x14) *
                       (ulong)(this->driverdata).channelExpression[uVar13] *
                       (ulong)(this->driverdata).channelVolume[uVar13];
        volume = SUB164(auVar3 / ZEXT816(0x3f01),0);
        if (0x7e < volume) {
          volume = 0x7f;
        }
        *(uint *)(puVar9 + -2) = volume;
        OPLio::OPLwriteVolume(pOVar2,(uint)uVar12,(OPL2instrument *)puVar9[-1],volume);
      }
      puVar9 = puVar9 + 5;
    }
    break;
  case 8:
    (this->driverdata).channelSustain[uVar13] = uVar11;
    if (value < 0x40) {
      releaseSustain(this,channel);
      return;
    }
    break;
  case 10:
    (this->driverdata).channelRPN[uVar13] =
         (ushort)(value << 7) | (this->driverdata).channelRPN[uVar13] & 0x7f;
    break;
  case 0xb:
    (this->driverdata).channelRPN[uVar13] = (this->driverdata).channelRPN[uVar13] & 0x3f80 | uVar4;
    break;
  case 0xc:
  case 0xd:
    (this->driverdata).channelRPN[uVar13] = 0x3fff;
    break;
  case 0xe:
    if ((this->driverdata).channelRPN[uVar13] != 0) {
      return;
    }
    uVar5 = uVar4 * 100 + (this->driverdata).channelPitchSens[uVar13] % 100;
    goto LAB_0033d3de;
  case 0xf:
    if ((this->driverdata).channelRPN[uVar13] != 0) {
      return;
    }
    uVar5 = ((this->driverdata).channelPitchSens[uVar13] / 100) * 100 + uVar4;
LAB_0033d3de:
    (this->driverdata).channelPitchSens[uVar13] = uVar5;
    break;
  case 0x10:
    pcVar10 = this->channels;
    for (uVar13 = 0; uVar13 < this->io->OPLchannels; uVar13 = uVar13 + 1) {
      if (pcVar10->channel == channel) {
        releaseChannel(this,(uint)uVar13,0);
      }
      pcVar10 = pcVar10 + 1;
    }
    break;
  case 0x11:
    puVar8 = &this->channels[0].flags;
    for (uVar12 = 0; uVar12 < this->io->OPLchannels; uVar12 = uVar12 + 1) {
      if (((channelEntry *)(puVar8 + -2))->channel == channel) {
        if ((this->driverdata).channelSustain[uVar13] < 0x40) {
          releaseChannel(this,(uint)uVar12,0);
        }
        else {
          *puVar8 = *puVar8 | 2;
        }
      }
      puVar8 = puVar8 + 0x28;
    }
  }
  return;
}

Assistant:

void musicBlock::OPLchangeControl(uint channel, uchar controller, int value)
{
	uint i;
	uint id = channel;

	switch (controller)
	{
	case ctrlPatch:			/* change instrument */
		OPLprogramChange(channel, value);
		break;

	case ctrlModulation:
		driverdata.channelModulation[channel] = value;
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				uchar flags = ch->flags;
				ch->time = MLtime;
				if (value >= MOD_MIN)
				{
					ch->flags |= CH_VIBRATO;
					if (ch->flags != flags)
						writeModulation(i, ch->instr, 1);
				} else {
					ch->flags &= ~CH_VIBRATO;
					if (ch->flags != flags)
						writeModulation(i, ch->instr, 0);
				}
			}
		}
		break;

	case ctrlVolume:		/* change volume */
		driverdata.channelVolume[channel] = value;
		/* fall-through */
	case ctrlExpression:	/* change expression */
		if (controller == ctrlExpression)
		{
			driverdata.channelExpression[channel] = value;
		}
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				ch->time = MLtime;
				ch->realvolume = calcVolume(driverdata.channelVolume[channel],
					driverdata.channelExpression[channel], ch->volume);
				io->OPLwriteVolume(i, ch->instr, ch->realvolume);
			}
		}
		break;

	case ctrlPan:			/* change pan (balance) */
		driverdata.channelPan[channel] = value -= 64;
		for(i = 0; i < io->OPLchannels; i++)
		{
			struct channelEntry *ch = &channels[i];
			if (ch->channel == id)
			{
				ch->time = MLtime;
				io->OPLwritePan(i, ch->instr, value);
			}
		}
		break;

	case ctrlSustainPedal:		/* change sustain pedal (hold) */
		driverdata.channelSustain[channel] = value;
		if (value < 0x40)
			releaseSustain(channel);
		break;

	case ctrlNotesOff:			/* turn off all notes that are not sustained */
		for (i = 0; i < io->OPLchannels; ++i)
		{
			if (channels[i].channel == id)
			{
				if (driverdata.channelSustain[id] < 0x40)
					releaseChannel(i, 0);
				else
					channels[i].flags |= CH_SUSTAIN;
			}
		}
		break;

	case ctrlSoundsOff:			/* release all notes for this channel */
		for (i = 0; i < io->OPLchannels; ++i)
		{
			if (channels[i].channel == id)
			{
				releaseChannel(i, 0);
			}
		}
		break;

	case ctrlRPNHi:
		driverdata.channelRPN[id] = (driverdata.channelRPN[id] & 0x007F) | (value << 7);
		break;

	case ctrlRPNLo:
		driverdata.channelRPN[id] = (driverdata.channelRPN[id] & 0x3F80) | value;
		break;

	case ctrlNRPNLo:
	case ctrlNRPNHi:
		driverdata.channelRPN[id] = 0x3FFF;
		break;

	case ctrlDataEntryHi:
		if (driverdata.channelRPN[id] == 0)
		{
			driverdata.channelPitchSens[id] = value * 100 + (driverdata.channelPitchSens[id] % 100);
		}
		break;

	case ctrlDataEntryLo:
		if (driverdata.channelRPN[id] == 0)
		{
			driverdata.channelPitchSens[id] = value + (driverdata.channelPitchSens[id] / 100) * 100;
		}
		break;
	}
}